

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O0

void __thiscall highwayhash::ThreadPool::ThreadPool(ThreadPool *this,int num_threads)

{
  ThreadPool *local_30;
  int local_28;
  int i;
  int local_14;
  ThreadPool *pTStack_10;
  int num_threads_local;
  ThreadPool *this_local;
  
  this->num_threads_ = num_threads;
  local_14 = num_threads;
  pTStack_10 = this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  std::mutex::mutex(&this->mutex_);
  std::condition_variable::condition_variable(&this->workers_ready_cv_);
  this->workers_ready_ = 0;
  std::condition_variable::condition_variable(&this->worker_start_cv_);
  std::function<void_(int)>::function(&this->task_);
  std::atomic<int>::atomic(&this->num_reserved_,0);
  if (0 < this->num_threads_) {
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve
              (&this->threads_,(long)this->num_threads_);
    for (local_28 = 0; local_28 < this->num_threads_; local_28 = local_28 + 1) {
      local_30 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(highwayhash::ThreadPool*),highwayhash::ThreadPool*>
                ((vector<std::thread,std::allocator<std::thread>> *)&this->threads_,ThreadFunc,
                 &local_30);
    }
    this->padding_[0] = 0;
    WorkersReadyBarrier(this);
    return;
  }
  printf("data_parallel check failed at line %d\n",0x46);
  abort();
}

Assistant:

explicit ThreadPool(
      const int num_threads = std::thread::hardware_concurrency())
      : num_threads_(num_threads) {
    DATA_PARALLEL_CHECK(num_threads_ > 0);
    threads_.reserve(num_threads_);
    for (int i = 0; i < num_threads_; ++i) {
      threads_.emplace_back(ThreadFunc, this);
    }

    padding_[0] = 0;  // avoid unused member warning.

    WorkersReadyBarrier();
  }